

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupMux(int iVar,Gia_Man_t *pCof1,Gia_Man_t *pCof0)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  Gia_Man_t *p;
  size_t sVar11;
  char *pcVar12;
  Gia_Obj_t *pGVar13;
  Vec_Int_t *pVVar14;
  Gia_Man_t *pGVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  
  if (pCof0->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCof0) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x666,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof1->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(pCof1) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x667,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof0->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pCof0) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x668,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if (pCof1->vCos->nSize != 1) {
    __assert_fail("Gia_ManCoNum(pCof1) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x669,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  iVar10 = pCof1->vCis->nSize;
  if (iVar10 != pCof0->vCis->nSize) {
    __assert_fail("Gia_ManCiNum(pCof1) == Gia_ManCiNum(pCof0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x66a,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  if ((iVar < 0) || (iVar10 <= iVar)) {
    __assert_fail("iVar >= 0 && iVar < Gia_ManCiNum(pCof1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x66b,"Gia_Man_t *Gia_ManDupMux(int, Gia_Man_t *, Gia_Man_t *)");
  }
  p = Gia_ManStart(pCof0->nObjs + pCof1->nObjs);
  pcVar4 = pCof1->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar4);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar4);
  }
  p->pName = pcVar12;
  pcVar4 = pCof1->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar12 = (char *)0x0;
  }
  else {
    sVar11 = strlen(pcVar4);
    pcVar12 = (char *)malloc(sVar11 + 1);
    strcpy(pcVar12,pcVar4);
  }
  p->pSpec = pcVar12;
  Gia_ManHashAlloc(p);
  pGVar15 = pCof0;
  bVar9 = true;
  do {
    bVar8 = bVar9;
    Gia_ManFillValue(pGVar15);
    pGVar15->pObjs->Value = 0;
    pVVar14 = pGVar15->vCis;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        iVar10 = pVVar14->pArray[lVar19];
        if (((long)iVar10 < 0) || (pGVar15->nObjs <= iVar10)) goto LAB_001e196a;
        pGVar5 = pGVar15->pObjs;
        if (pGVar5 == (Gia_Obj_t *)0x0) break;
        if (bVar8) {
          pGVar13 = Gia_ManAppendObj(p);
          uVar6 = *(ulong *)pGVar13;
          *(ulong *)pGVar13 = uVar6 | 0x9fffffff;
          *(ulong *)pGVar13 =
               uVar6 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar7 = p->pObjs;
          if ((pGVar13 < pGVar7) || (pGVar7 + p->nObjs <= pGVar13)) {
LAB_001e1989:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar13 - (long)pGVar7) >> 2) * -0x55555555);
          pGVar7 = p->pObjs;
          if ((pGVar13 < pGVar7) || (pGVar7 + p->nObjs <= pGVar13)) goto LAB_001e1989;
          uVar16 = (int)((ulong)((long)pGVar13 - (long)pGVar7) >> 2) * 0x55555556;
          pVVar14 = pGVar15->vCis;
        }
        else {
          if (pCof0->vCis->nSize <= lVar19) goto LAB_001e19a8;
          iVar1 = pCof0->vCis->pArray[lVar19];
          if (((long)iVar1 < 0) || (pCof0->nObjs <= iVar1)) goto LAB_001e196a;
          uVar16 = pCof0->pObjs[iVar1].Value;
        }
        pGVar5[iVar10].Value = uVar16;
        lVar19 = lVar19 + 1;
      } while (lVar19 < pVVar14->nSize);
    }
    pVVar14 = pGVar15->vCos;
    if (0 < pVVar14->nSize) {
      lVar19 = 0;
      do {
        iVar10 = pVVar14->pArray[lVar19];
        if (((long)iVar10 < 0) || (pGVar15->nObjs <= iVar10)) goto LAB_001e196a;
        if (pGVar15->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar5 = pGVar15->pObjs + iVar10;
        Gia_ManDupCofactorVar_rec
                  (p,pGVar15,pGVar5 + -(ulong)((uint)*(undefined8 *)pGVar5 & 0x1fffffff));
        lVar19 = lVar19 + 1;
        pVVar14 = pGVar15->vCos;
      } while (lVar19 < pVVar14->nSize);
    }
    pGVar15 = pCof1;
    bVar9 = false;
  } while (bVar8);
  pVVar14 = pCof0->vCos;
  if (0 < pVVar14->nSize) {
    lVar19 = 0;
LAB_001e1830:
    iVar10 = pVVar14->pArray[lVar19];
    if (((long)iVar10 < 0) || (pCof0->nObjs <= iVar10)) {
LAB_001e196a:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar5 = pCof0->pObjs;
    if (pGVar5 != (Gia_Obj_t *)0x0) {
      if (pCof0->vCis->nSize <= iVar) {
LAB_001e19a8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar16 = pCof0->vCis->pArray[(uint)iVar];
      if (((long)(int)uVar16 < 0) || ((uint)pCof0->nObjs <= uVar16)) goto LAB_001e196a;
      if (pCof1->vCos->nSize <= lVar19) goto LAB_001e19a8;
      iVar1 = pCof1->vCos->pArray[lVar19];
      if (((long)iVar1 < 0) || (pCof1->nObjs <= iVar1)) goto LAB_001e196a;
      uVar18 = (uint)*(undefined8 *)(pCof1->pObjs + iVar1);
      uVar2 = (pCof1->pObjs + iVar1)[-(ulong)(uVar18 & 0x1fffffff)].Value;
      if ((int)uVar2 < 0) {
LAB_001e19c7:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar17 = (uint)*(undefined8 *)(pGVar5 + iVar10);
      uVar3 = (pGVar5 + iVar10)[-(ulong)(uVar17 & 0x1fffffff)].Value;
      if ((int)uVar3 < 0) goto LAB_001e19c7;
      iVar10 = Gia_ManHashMux(p,pGVar5[(int)uVar16].Value,uVar18 >> 0x1d & 1 ^ uVar2,
                              uVar17 >> 0x1d & 1 ^ uVar3);
      Gia_ManAppendCo(p,iVar10);
      lVar19 = lVar19 + 1;
      pVVar14 = pCof0->vCos;
      if (lVar19 < pVVar14->nSize) goto LAB_001e1830;
    }
  }
  pGVar15 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar15;
}

Assistant:

Gia_Man_t * Gia_ManDupMux( int iVar, Gia_Man_t * pCof1, Gia_Man_t * pCof0 )
{
    Gia_Man_t * pGia[2] = {pCof0, pCof1};
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, n;
    assert( Gia_ManRegNum(pCof0) == 0 );
    assert( Gia_ManRegNum(pCof1) == 0 );
    assert( Gia_ManCoNum(pCof0) == 1 );
    assert( Gia_ManCoNum(pCof1) == 1 );
    assert( Gia_ManCiNum(pCof1) == Gia_ManCiNum(pCof0) );
    assert( iVar >= 0 && iVar < Gia_ManCiNum(pCof1) );
    pNew = Gia_ManStart( Gia_ManObjNum(pCof1) + Gia_ManObjNum(pCof0) );
    pNew->pName = Abc_UtilStrsav( pCof1->pName );
    pNew->pSpec = Abc_UtilStrsav( pCof1->pSpec );
    Gia_ManHashAlloc( pNew );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManFillValue( pGia[n] );
        Gia_ManConst0(pGia[n])->Value = 0;
        Gia_ManForEachCi( pGia[n], pObj, i )
            pObj->Value = n ? Gia_ManCi(pGia[0], i)->Value : Gia_ManAppendCi(pNew);
        Gia_ManForEachCo( pGia[n], pObj, i )
            Gia_ManDupCofactorVar_rec( pNew, pGia[n], Gia_ObjFanin0(pObj) );
    }
    Gia_ManForEachCo( pGia[0], pObj, i )
    {
        int Ctrl = Gia_ManCi(pGia[0], iVar)->Value;
        int Lit1 = Gia_ObjFanin0Copy(Gia_ManCo(pGia[1], i));
        int Lit0 = Gia_ObjFanin0Copy(pObj);
        Gia_ManAppendCo( pNew, Gia_ManHashMux( pNew, Ctrl, Lit1, Lit0 ) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}